

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

String * __thiscall
kj::PathPtr::toWin32StringImpl
          (String *__return_storage_ptr__,PathPtr *this,bool absolute,bool forApi)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  String *pSVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  undefined7 in_register_00000011;
  char (*params) [3];
  size_t extraout_RDX;
  size_t sVar8;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  String *p;
  String *pSVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  Path *pPVar13;
  size_t __n;
  char cVar14;
  size_t i;
  long lVar15;
  Path *pPVar16;
  ArrayPtr<const_char> part;
  StringPtr part_00;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_87;
  byte local_7c;
  DebugExpression<bool> _kjCondition_1;
  Fault f;
  
  part.size_ = (char (*) [2])CONCAT71(in_register_00000011,absolute);
  sVar8 = (this->parts).size_;
  if (sVar8 == 0) {
    __kjCondition = (char *)CONCAT71(uStack_87,!absolute);
    if (absolute) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,200,FAILED,"!absolute","_kjCondition,\"absolute path is missing disk designator\""
                 ,&_kjCondition,(char (*) [41])"absolute path is missing disk designator");
      kj::_::Debug::Fault::~Fault(&f);
      str<char_const(&)[3]>(__return_storage_ptr__,(kj *)"\\\\",params);
      return __return_storage_ptr__;
    }
    str<char_const(&)[2]>(__return_storage_ptr__,(kj *)0x59997d,part.size_);
    return __return_storage_ptr__;
  }
  pSVar9 = (this->parts).ptr;
  if (absolute) {
    pPVar16 = (Path *)(pSVar9->content).size_;
    pPVar13 = pPVar16;
    if (pPVar16 != (Path *)0x0) {
      pPVar13 = (Path *)(pSVar9->content).ptr;
    }
    pcVar3 = (char *)0x0;
    if (pPVar16 != (Path *)0x0) {
      pcVar3 = (char *)((long)&pPVar16[-1].parts.disposer + 7);
    }
    if ((pcVar3 == (char *)0x2) && (*(char *)((long)&(pPVar13->parts).ptr + 1) == ':')) {
      bVar1 = *(byte *)&(pPVar13->parts).ptr;
      if ('`' < (char)bVar1) {
        if (bVar1 < 0x7b) {
          uVar7 = (ulong)forApi << 2;
          local_7c = forApi;
          goto LAB_004c0f1e;
        }
        goto LAB_004c0f44;
      }
      if (0x19 < (byte)(bVar1 + 0xbf)) goto LAB_004c0f44;
      lVar5 = 0;
    }
    else {
LAB_004c0f44:
      part.ptr = pcVar3;
      bVar2 = Path::isNetbiosName(pPVar13,part);
      lVar5 = 1;
      if (!bVar2) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70],kj::String_const&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0xd6,FAILED,(char *)0x0,
                   "\"absolute win32 path must start with drive letter or netbios host name\", parts[0]"
                   ,(char (*) [70])
                    "absolute win32 path must start with drive letter or netbios host name",pSVar9);
        kj::_::Debug::Fault::fatal(&f);
      }
    }
    cVar14 = (char)lVar5;
    if (forApi) {
      uVar7 = lVar5 * 4 + 4;
      local_7c = 1;
    }
    else {
      uVar7 = (ulong)(uint)((int)lVar5 * 2);
      local_7c = 0;
    }
  }
  else {
    uVar7 = 0;
    local_7c = 0;
LAB_004c0f1e:
    cVar14 = '\0';
  }
  sVar10 = (sVar8 + uVar7) - 1;
  lVar5 = 0;
  do {
    lVar15 = *(long *)((long)&(pSVar9->content).size_ + lVar5);
    lVar12 = 0;
    if (lVar15 != 0) {
      lVar12 = lVar15 + -1;
    }
    sVar10 = sVar10 + lVar12;
    lVar5 = lVar5 + 0x18;
  } while (sVar8 * 0x18 != lVar5);
  heapString(__return_storage_ptr__,sVar10);
  pcVar3 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar3 != (char *)0x0) {
    pcVar3 = (__return_storage_ptr__->content).ptr;
  }
  sVar8 = extraout_RDX;
  if (local_7c == 0) {
    __kjCondition = pcVar3;
    if (cVar14 == '\0') goto LAB_004c101b;
    pcVar6 = pcVar3 + 1;
    *pcVar3 = '\\';
    sVar8 = 2;
  }
  else {
    builtin_strncpy(pcVar3,"\\\\?\\",4);
    __kjCondition = pcVar3 + 4;
    if (cVar14 == '\0') goto LAB_004c101b;
    pcVar3[4] = 'U';
    pcVar3[5] = 'N';
    pcVar6 = pcVar3 + 7;
    pcVar3[6] = 'C';
    sVar8 = 8;
  }
  *pcVar6 = '\\';
  __kjCondition = pcVar3 + sVar8;
LAB_004c101b:
  sVar10 = (this->parts).size_;
  if (sVar10 != 0) {
    pSVar9 = (this->parts).ptr;
    pSVar4 = pSVar9 + sVar10;
    bVar2 = false;
    do {
      if (bVar2) {
        *__kjCondition = '\\';
        __kjCondition = __kjCondition + 1;
      }
      pPVar16 = (Path *)(pSVar9->content).ptr;
      sVar10 = (pSVar9->content).size_;
      pPVar13 = pPVar16;
      if (sVar10 == 0) {
        pPVar13 = (Path *)0x524569;
      }
      part_00.content.ptr = (char *)(sVar10 + (sVar10 == 0));
      part_00.content.size_ = sVar8;
      bVar2 = Path::isWin32Special(pPVar13,part_00);
      pcVar3 = __kjCondition;
      _kjCondition_1.value = !bVar2;
      if (_kjCondition_1.value) {
        if (sVar10 == 0) {
          pPVar16 = (Path *)0x0;
        }
        __n = sVar10 - 1;
        if (sVar10 == 0) {
          __n = 0;
        }
        memcpy(__kjCondition,pPVar16,__n);
        sVar8 = (pSVar9->content).size_;
        lVar5 = sVar8 - 1;
        if (sVar8 == 0) {
          lVar5 = 0;
        }
        __kjCondition = pcVar3 + lVar5;
        sVar8 = extraout_RDX_01;
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[38],kj::String_const&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0xfd,FAILED,"!Path::isWin32Special(p)",
                   "_kjCondition,\"path cannot contain DOS reserved name\", p",&_kjCondition_1,
                   (char (*) [38])"path cannot contain DOS reserved name",pSVar9);
        if (1 < (pSVar9->content).size_) {
          uVar7 = 0;
          pcVar3 = __kjCondition;
          do {
            __kjCondition = pcVar3 + 1;
            *pcVar3 = '|';
            uVar7 = uVar7 + 1;
            sVar8 = (pSVar9->content).size_;
            uVar11 = 0;
            if (sVar8 != 0) {
              uVar11 = sVar8 - 1;
            }
            pcVar3 = __kjCondition;
          } while (uVar7 < uVar11);
        }
        kj::_::Debug::Fault::~Fault(&f);
        sVar8 = extraout_RDX_00;
      }
      pSVar9 = pSVar9 + 1;
      bVar2 = true;
    } while (pSVar9 != pSVar4);
  }
  sVar8 = (__return_storage_ptr__->content).size_;
  pcVar3 = (__return_storage_ptr__->content).ptr + (sVar8 - 1);
  if (sVar8 == 0) {
    pcVar3 = (char *)0x0;
  }
  if (__kjCondition == pcVar3) {
    lVar5 = 0;
    if (sVar8 != 0) {
      lVar5 = sVar8 - 1;
    }
    if (sVar8 != 0 && sVar8 - 1 != 0) {
      lVar15 = 0;
      f.exception = (Exception *)&_kjCondition;
      do {
        if (((__return_storage_ptr__->content).ptr[lVar15] == ':') &&
           ((ulong)local_7c * 4 + 1 != lVar15 || !absolute)) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[80],kj::String&>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x117,FAILED,(char *)0x0,
                     "\"colons are prohibited in win32 paths to avoid triggering alternate data streams\", result"
                     ,(char (*) [80])
                      "colons are prohibited in win32 paths to avoid triggering alternate data streams"
                     ,__return_storage_ptr__);
          (__return_storage_ptr__->content).ptr[lVar15] = '|';
          kj::_::Debug::Fault::~Fault(&f);
        }
        lVar15 = lVar15 + 1;
      } while (lVar5 != lVar15);
    }
    return __return_storage_ptr__;
  }
  f.exception = (Exception *)&_kjCondition;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
            ((Fault *)&_kjCondition_1,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x10a,FAILED,"ptr == result.end()","_kjCondition,",
             (DebugComparison<char_*&,_char_*> *)&f);
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1);
}

Assistant:

String PathPtr::toWin32StringImpl(bool absolute, bool forApi) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    KJ_REQUIRE(!absolute, "absolute path is missing disk designator") {
      break;
    }
    return absolute ? kj::str("\\\\") : kj::str(".");
  }

  bool isUncPath = false;
  if (absolute) {
    if (Path::isWin32Drive(parts[0])) {
      // It's a win32 drive
    } else if (Path::isNetbiosName(parts[0])) {
      isUncPath = true;
    } else {
      KJ_FAIL_REQUIRE("absolute win32 path must start with drive letter or netbios host name",
                      parts[0]);
    }
  } else {
    // Currently we do nothing differently in the forApi case for relative paths.
    forApi = false;
  }

  size_t size = forApi
      ? (isUncPath ? 8 : 4) + (parts.size() - 1)
      : (isUncPath ? 2 : 0) + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = heapString(size);

  char* ptr = result.begin();

  if (forApi) {
    *ptr++ = '\\';
    *ptr++ = '\\';
    *ptr++ = '?';
    *ptr++ = '\\';
    if (isUncPath) {
      *ptr++ = 'U';
      *ptr++ = 'N';
      *ptr++ = 'C';
      *ptr++ = '\\';
    }
  } else {
    if (isUncPath) {
      *ptr++ = '\\';
      *ptr++ = '\\';
    }
  }

  bool leadingSlash = false;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '\\';
    leadingSlash = true;

    KJ_REQUIRE(!Path::isWin32Special(p), "path cannot contain DOS reserved name", p) {
      // Recover by blotting out the name with invalid characters which Win32 syscalls will reject.
      for (size_t i = 0; i < p.size(); i++) {
        *ptr++ = '|';
      }
      goto skip;
    }

    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  skip:;
  }

  KJ_ASSERT(ptr == result.end());

  // Check for colons (other than in drive letter), which on NTFS would be interpreted as an
  // "alternate data stream", which can lead to surprising results. If we want to support ADS, we
  // should do so using an explicit API. Note that this check also prevents a relative path from
  // appearing to start with a drive letter.
  for (size_t i: kj::indices(result)) {
    if (result[i] == ':') {
      if (absolute && i == (forApi ? 5 : 1)) {
        // False alarm: this is the drive letter.
      } else {
        KJ_FAIL_REQUIRE(
            "colons are prohibited in win32 paths to avoid triggering alternate data streams",
            result) {
          // Recover by using a different character which we know Win32 syscalls will reject.
          result[i] = '|';
          break;
        }
      }
    }
  }

  return result;
}